

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::buildLiveness(BaseRAPass *this)

{
  RAWorkReg *pRVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  RABlock **ppRVar5;
  RAWorkReg **ppRVar6;
  uint *puVar7;
  ZoneVector<unsigned_int> *pZVar8;
  uint32_t *puVar9;
  long in_RDI;
  float __x;
  float fVar10;
  float __x_00;
  RALiveStats *stats;
  float freq;
  uint32_t width;
  LiveRegSpans *spans;
  RAWorkReg *workReg_4;
  uint32_t useId;
  RegGroup group;
  Error _err_14;
  bool wasOpen;
  LiveRegSpans *liveSpans;
  RAWorkReg *workReg_3;
  uint32_t workId_1;
  RATiedReg *tiedReg_1;
  uint32_t j_2;
  uint32_t count_1;
  RATiedReg *tiedRegs_1;
  RAInst *raInst_1;
  InstNode *inst_1;
  Error _err_13;
  RAWorkReg *workReg_2;
  ForEachBitSet it;
  RALiveCount maxLiveCount;
  RALiveCount curLiveCount;
  uint32_t endPosition;
  BaseNode *stop_1;
  BaseNode *node_1;
  uint32_t blockId_1;
  RABlock *block_4;
  uint32_t position;
  Error _err_12;
  Error _err_11;
  RAWorkReg *workReg_1;
  Error _err_10;
  Error _err_9;
  RABlock *block_3;
  Error _err_8;
  RABlock *pred;
  uint32_t j_1;
  uint32_t numPredecessors;
  RABlocks *predecessors;
  uint32_t blockId;
  RABlock *block_2;
  Error _err_7;
  RABlock *block_1;
  Error _err_6;
  Error _err_5;
  ZoneBitVector workBits;
  ZoneStack<asmjit::v1_14::RABlock_*> workList;
  uint32_t numVisits;
  Error _err_4;
  RAWorkReg *consecutiveParentReg;
  RAWorkReg *workReg;
  uint32_t workId;
  RATiedReg *tiedReg;
  uint32_t j;
  uint32_t count;
  RATiedReg *tiedRegs;
  RAInst *raInst;
  InstNode *inst;
  uint32_t nInsts;
  BaseNode *stop;
  BaseNode *node;
  Error _err_3;
  RABlock *block;
  Error _err_2;
  Error _err_1;
  Error _err;
  ZoneVector<unsigned_int> nInstsPerBlock;
  ZoneVector<unsigned_int> nOutsPerWorkReg;
  ZoneVector<unsigned_int> nUsesPerWorkReg;
  uint32_t numBitWords;
  uint32_t numWorkRegs;
  uint32_t numReachableBlocks;
  uint32_t numAllBlocks;
  uint32_t i;
  StringTmp<512UL> sb;
  Logger *logger;
  ZoneAllocator *in_stack_fffffffffffff3c8;
  ZoneVector<unsigned_int> *in_stack_fffffffffffff3d0;
  ZoneVector<asmjit::v1_14::RAWorkReg_*> *in_stack_fffffffffffff3d8;
  RABlock *in_stack_fffffffffffff3e0;
  RABlock *in_stack_fffffffffffff3e8;
  RABlock *in_stack_fffffffffffff3f0;
  undefined4 in_stack_fffffffffffff3f8;
  undefined4 in_stack_fffffffffffff3fc;
  RAWorkReg *in_stack_fffffffffffff400;
  undefined4 in_stack_fffffffffffff424;
  undefined1 newBitsValue;
  undefined8 in_stack_fffffffffffff428;
  ZoneAllocator *in_stack_fffffffffffff430;
  ZoneBitVector *in_stack_fffffffffffff438;
  undefined4 in_stack_fffffffffffff440;
  undefined4 in_stack_fffffffffffff444;
  int iVar11;
  RAWorkReg *in_stack_fffffffffffff448;
  BaseRAPass *in_stack_fffffffffffff450;
  ZoneAllocator *local_b98;
  StringTmp<512UL> *this_00;
  Logger *local_b58;
  uint local_b20;
  byte local_b19;
  Error local_b18;
  byte local_b11;
  RAWorkReg *local_b10;
  RAWorkReg *local_b08;
  undefined4 local_afc;
  undefined4 *local_af8;
  uint local_af0;
  uint local_aec;
  long local_ae8;
  long local_ae0;
  long local_ad8;
  Error local_acc;
  RAWorkReg *local_ac8;
  long local_aa8;
  undefined8 local_a9c;
  undefined8 local_a94;
  undefined8 local_a8c;
  undefined8 local_a84;
  int local_a7c;
  long local_a78;
  long local_a70;
  int local_a64;
  RABlock *local_a60;
  int local_a54;
  Error local_a50;
  Error local_a4c;
  RAWorkReg *local_a48;
  Error local_a3c;
  uint local_a38;
  Error local_a34;
  RABlock *local_a30;
  Error local_a24;
  RABlock *local_a20;
  uint local_a18;
  uint local_a14;
  RABlock *local_a10;
  undefined4 local_a04;
  RABlock *local_a00;
  Error local_9f4;
  RABlock *local_9f0;
  Error local_9e8;
  Error local_9e4;
  undefined8 local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  ZoneStack<asmjit::v1_14::RABlock_*> local_9d0;
  uint local_9b8;
  Error local_9b4;
  RAWorkReg *local_9b0;
  RAWorkReg *local_9a8;
  undefined4 local_99c;
  undefined4 *local_998;
  uint local_990;
  uint local_98c;
  long local_988;
  long local_980;
  long *local_978;
  uint local_96c;
  long *local_968;
  long *local_960;
  Error local_954;
  RABlock *local_950;
  Error local_944;
  Error local_940;
  Error local_93c;
  ZoneVectorBase local_938;
  ZoneVectorBase local_928;
  ZoneVectorBase local_918;
  int local_908;
  uint local_904;
  uint local_900;
  uint local_8fc;
  uint local_8f8;
  uint local_8f4;
  StringTmp<512UL> local_8f0;
  ZoneVector<unsigned_int> aZStack_8ef [7];
  ZoneAllocator *local_8e8;
  ZoneVector<unsigned_int> *local_8d8;
  char *in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7cc;
  char *in_stack_fffffffffffff7d0;
  Error local_6b4;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  RAWorkReg *local_2c0;
  undefined4 *local_2b8;
  undefined4 *local_2b0;
  undefined4 *local_2a8;
  uint local_29c;
  RAWorkReg *local_298;
  uint local_28c;
  RAWorkReg *local_288;
  RAWorkReg *local_280;
  RAWorkReg *local_278;
  uint local_26c;
  RAWorkReg *local_268;
  uint local_25c;
  RAWorkReg *local_258;
  undefined4 *local_250;
  undefined4 *local_248;
  undefined4 *local_240;
  undefined4 *local_238;
  uint local_22c;
  RAWorkReg *local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  RABlock *local_1f0;
  RAWorkReg *local_1e8;
  RAWorkReg *local_1e0;
  long local_1d8;
  undefined4 local_1cc;
  RAWorkReg *local_1c8;
  undefined4 local_1bc;
  RAWorkReg *local_1b8;
  StringTmp<512UL> *local_1b0;
  StringTmp<512UL> *local_1a8;
  undefined4 local_19c;
  RABlock *local_198;
  StringTmp<512UL> *local_190;
  StringTmp<512UL> *local_188;
  StringTmp<512UL> *local_180;
  StringTmp<512UL> *local_178;
  StringTmp<512UL> *local_170;
  StringTmp<512UL> *local_168;
  undefined1 local_159;
  long *local_158;
  undefined1 local_149;
  long local_148;
  RAWorkReg *local_140;
  RAWorkReg *local_138;
  RAWorkReg *local_130;
  RAWorkReg *local_128;
  undefined4 local_11c;
  undefined4 *local_118;
  undefined4 local_10c;
  undefined4 *local_108;
  undefined4 local_fc;
  undefined4 *local_f8;
  undefined4 local_ec;
  undefined4 *local_e8;
  undefined4 local_dc;
  undefined4 *local_d8;
  undefined4 local_cc;
  undefined4 *local_c8;
  undefined4 local_bc;
  undefined4 *local_b8;
  undefined4 local_ac;
  undefined4 *local_a8;
  undefined4 local_9c;
  uint *local_98;
  undefined4 local_8c;
  uint *local_88;
  undefined4 local_7c;
  uint *local_78;
  undefined4 local_6c;
  uint local_68;
  undefined4 local_64;
  RAWorkReg *local_60;
  undefined4 local_54;
  RAWorkReg *local_50;
  undefined4 local_44;
  RAWorkReg *local_40;
  undefined4 local_34;
  RAWorkReg *local_30;
  uint *local_28;
  uint *local_20;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  StringTmp<512UL> *local_8;
  
  bVar2 = Support::test<asmjit::v1_14::DiagnosticOptions,asmjit::v1_14::DiagnosticOptions>
                    (*(DiagnosticOptions *)(in_RDI + 0x94),kRADebugLiveness);
  if (bVar2) {
    local_b58 = *(Logger **)(in_RDI + 0x80);
  }
  else {
    local_b58 = (Logger *)0x0;
  }
  this_00 = &local_8f0;
  local_8 = this_00;
  memset(this_00,0,0x20);
  StringTmp<512UL>::_resetToTemporary(this_00);
  fVar10 = __x;
  if (local_b58 != (Logger *)0x0) {
    fVar10 = Logger::logf(local_b58,__x);
  }
  local_8f8 = *(uint *)(in_RDI + 0xb8);
  local_8fc = *(uint *)(in_RDI + 0xd8);
  local_900 = *(uint *)(in_RDI + 0x148);
  local_904 = local_900 + 0x3f >> 6;
  if (local_900 == 0) {
    if (local_b58 != (Logger *)0x0) {
      Logger::logf(local_b58,fVar10);
    }
    local_6b4 = 0;
    local_908 = 1;
  }
  else {
    ZoneVectorBase::ZoneVectorBase(&local_918);
    ZoneVectorBase::ZoneVectorBase(&local_928);
    ZoneVectorBase::ZoneVectorBase(&local_938);
    local_93c = ZoneVector<unsigned_int>::resize
                          (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,0);
    if (local_93c == 0) {
      local_940 = ZoneVector<unsigned_int>::resize
                            (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,0);
      if (local_940 == 0) {
        local_944 = ZoneVector<unsigned_int>::resize
                              (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,0);
        if (local_944 == 0) {
          for (local_8f4 = 0; newBitsValue = (undefined1)((uint)in_stack_fffffffffffff424 >> 0x18),
              local_8f4 < local_8fc; local_8f4 = local_8f4 + 1) {
            ppRVar5 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                                ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_fffffffffffff3d8,
                                 (size_t)in_stack_fffffffffffff3d0);
            local_950 = *ppRVar5;
            local_954 = RABlock::resizeLiveBits
                                  (in_stack_fffffffffffff3e8,
                                   (uint32_t)((ulong)in_stack_fffffffffffff3e0 >> 0x20));
            if (local_954 != 0) {
              local_908 = 1;
              local_6b4 = local_954;
              goto LAB_00158804;
            }
            local_960 = *(long **)(local_950 + 0x18);
            local_968 = *(long **)(local_950 + 0x10);
            local_96c = 0;
            while( true ) {
              local_158 = local_960;
              local_159 = 0x20;
              bVar2 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                                (*(NodeFlags *)((long)local_960 + 0x11),kActsAsInst);
              if (bVar2) {
                local_978 = local_960;
                local_980 = local_960[4];
                if (local_980 == 0) {
                  DebugUtils::assertionFailed
                            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
                             in_stack_fffffffffffff7c0);
                }
                local_988 = local_980 + 0x4c;
                local_98c = *(uint *)(local_980 + 0x10);
                for (local_990 = 0; local_990 < local_98c; local_990 = local_990 + 1) {
                  local_998 = (undefined4 *)(local_988 + (ulong)local_990 * 0x20);
                  local_99c = *local_998;
                  puVar7 = ZoneVector<unsigned_int>::operator[]
                                     ((ZoneVector<unsigned_int> *)in_stack_fffffffffffff3d8,
                                      (size_t)in_stack_fffffffffffff3d0);
                  *puVar7 = *puVar7 + 1;
                  local_b8 = local_998;
                  local_bc = 2;
                  bVar2 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                    (local_998[2],kWrite);
                  uVar3 = (uint)bVar2;
                  puVar7 = ZoneVector<unsigned_int>::operator[]
                                     ((ZoneVector<unsigned_int> *)in_stack_fffffffffffff3d8,
                                      (size_t)in_stack_fffffffffffff3d0);
                  *puVar7 = uVar3 + *puVar7;
                  bVar2 = ZoneBitVector::bitAt
                                    ((ZoneBitVector *)in_stack_fffffffffffff3d8,
                                     (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
                  if (bVar2) {
                    local_98 = local_998 + 2;
                    local_9c = 0x40000;
                    *local_98 = *local_98 | 0x40000;
                  }
                  else {
                    bVar2 = ZoneBitVector::bitAt
                                      ((ZoneBitVector *)in_stack_fffffffffffff3d8,
                                       (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
                    if (!bVar2) {
                      local_88 = local_998 + 2;
                      local_8c = 0x20000;
                      *local_88 = *local_88 | 0x20000;
                    }
                  }
                  local_68 = local_998[2];
                  local_6c = 3;
                  bVar2 = SUB81((ulong)in_stack_fffffffffffff3d0 >> 0x18,0);
                  uVar4 = (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20);
                  if ((local_68 & 3) == 2) {
                    ZoneBitVector::setBit((ZoneBitVector *)in_stack_fffffffffffff3d8,uVar4,bVar2);
                  }
                  else {
                    ZoneBitVector::setBit((ZoneBitVector *)in_stack_fffffffffffff3d8,uVar4,bVar2);
                    ZoneBitVector::setBit
                              ((ZoneBitVector *)in_stack_fffffffffffff3d8,
                               (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffff3d0 >> 0x18,0));
                  }
                  local_c8 = local_998;
                  local_cc = 0x1000;
                  bVar2 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                    (local_998[2],kLeadConsecutive);
                  if (bVar2) {
                    ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                        (in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0
                                        );
                    local_9a8 = *ppRVar6;
                    local_54 = 0x10;
                    local_40 = local_9a8 + 0x24;
                    local_44 = 0x10;
                    *(uint *)local_40 = *(uint *)local_40 | 0x10;
                    local_50 = local_9a8;
                  }
                  if (local_998[1] != -1) {
                    ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                        (in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0
                                        );
                    local_9b0 = *ppRVar6;
                    local_9b4 = RAWorkReg::addImmediateConsecutive
                                          ((RAWorkReg *)in_stack_fffffffffffff3d8,
                                           (ZoneAllocator *)in_stack_fffffffffffff3d0,
                                           (uint32_t)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
                    if (local_9b4 != 0) {
                      local_908 = 1;
                      local_6b4 = local_9b4;
                      goto LAB_00158804;
                    }
                  }
                }
                local_96c = local_96c + 1;
              }
              uVar3 = local_96c;
              if (local_960 == local_968) break;
              local_960 = (long *)*local_960;
              if (local_960 == (long *)0x0) {
                DebugUtils::assertionFailed
                          (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
                           in_stack_fffffffffffff7c0);
              }
            }
            puVar7 = ZoneVector<unsigned_int>::operator[]
                               ((ZoneVector<unsigned_int> *)in_stack_fffffffffffff3d8,
                                (size_t)in_stack_fffffffffffff3d0);
            *puVar7 = uVar3;
          }
          local_9b8 = local_8fc;
          ZoneStack<asmjit::v1_14::RABlock_*>::ZoneStack(&local_9d0);
          local_9e0 = 0;
          local_9d8 = 0;
          local_9d4 = 0;
          local_9e4 = ZoneStack<asmjit::v1_14::RABlock_*>::init
                                (&local_9d0,(EVP_PKEY_CTX *)(in_RDI + 0x18));
          if (local_9e4 == 0) {
            local_9e8 = ZoneBitVector::_resize
                                  (in_stack_fffffffffffff438,in_stack_fffffffffffff430,
                                   (uint32_t)((ulong)in_stack_fffffffffffff428 >> 0x20),
                                   (uint32_t)in_stack_fffffffffffff428,(bool)newBitsValue);
            if (local_9e8 == 0) {
              for (local_8f4 = 0; local_8f4 < local_8fc; local_8f4 = local_8f4 + 1) {
                ppRVar5 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                                    ((ZoneVector<asmjit::v1_14::RABlock_*> *)
                                     in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0);
                local_9f0 = *ppRVar5;
                LiveOps::recalcInOut
                          (in_stack_fffffffffffff3e0,
                           (uint32_t)((ulong)in_stack_fffffffffffff3d8 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff3d8 >> 0x18,0));
                local_9f4 = ZoneStack<asmjit::v1_14::RABlock_*>::append
                                      ((ZoneStack<asmjit::v1_14::RABlock_*> *)
                                       CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8)
                                       ,in_stack_fffffffffffff3f0);
                if (local_9f4 != 0) {
                  local_908 = 1;
                  local_6b4 = local_9f4;
                  goto LAB_00157021;
                }
              }
              while (bVar2 = ZoneStackBase::empty((ZoneStackBase *)in_stack_fffffffffffff3c8),
                    ((bVar2 ^ 0xffU) & 1) != 0) {
                local_a00 = ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
                                      ((ZoneStack<asmjit::v1_14::RABlock_*> *)
                                       in_stack_fffffffffffff3e0);
                local_a04 = *(undefined4 *)(local_a00 + 8);
                ZoneBitVector::setBit
                          ((ZoneBitVector *)in_stack_fffffffffffff3d8,
                           (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff3d0 >> 0x18,0));
                bVar2 = LiveOps::recalcInOut
                                  (in_stack_fffffffffffff3e0,
                                   (uint32_t)((ulong)in_stack_fffffffffffff3d8 >> 0x20),
                                   SUB81((ulong)in_stack_fffffffffffff3d8 >> 0x18,0));
                if (bVar2) {
                  local_a10 = local_a00 + 0x58;
                  local_a14 = *(uint *)(local_a00 + 0x60);
                  for (local_a18 = 0; local_a18 < local_a14; local_a18 = local_a18 + 1) {
                    ppRVar5 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                                        ((ZoneVector<asmjit::v1_14::RABlock_*> *)
                                         in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0
                                        );
                    local_a20 = *ppRVar5;
                    bVar2 = ZoneBitVector::bitAt
                                      ((ZoneBitVector *)in_stack_fffffffffffff3d8,
                                       (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
                    if (!bVar2) {
                      ZoneBitVector::setBit
                                ((ZoneBitVector *)in_stack_fffffffffffff3d8,
                                 (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffff3d0 >> 0x18,0));
                      local_a24 = ZoneStack<asmjit::v1_14::RABlock_*>::append
                                            ((ZoneStack<asmjit::v1_14::RABlock_*> *)
                                             CONCAT44(in_stack_fffffffffffff3fc,
                                                      in_stack_fffffffffffff3f8),
                                             in_stack_fffffffffffff3f0);
                      if (local_a24 != 0) {
                        local_908 = 1;
                        local_6b4 = local_a24;
                        goto LAB_00157021;
                      }
                    }
                  }
                }
                local_9b8 = local_9b8 + 1;
              }
              ZoneStackBase::_init
                        ((ZoneStackBase *)in_stack_fffffffffffff400,
                         (ZoneAllocator *)
                         CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8),
                         (size_t)in_stack_fffffffffffff3f0);
              ZoneBitVector::release
                        ((ZoneBitVector *)in_stack_fffffffffffff3d8,
                         (ZoneAllocator *)in_stack_fffffffffffff3d0);
              local_908 = 0;
            }
            else {
              local_908 = 1;
              local_6b4 = local_9e8;
            }
          }
          else {
            local_908 = 1;
            local_6b4 = local_9e4;
          }
LAB_00157021:
          ZoneStack<asmjit::v1_14::RABlock_*>::~ZoneStack
                    ((ZoneStack<asmjit::v1_14::RABlock_*> *)0x15702e);
          if (local_908 == 0) {
            if (local_b58 != (Logger *)0x0) {
              Logger::logf(local_b58,__x_00);
              for (local_8f4 = 0; local_8f4 < local_8f8; local_8f4 = local_8f4 + 1) {
                ppRVar5 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                                    ((ZoneVector<asmjit::v1_14::RABlock_*> *)
                                     in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0);
                local_a30 = *ppRVar5;
                local_a38 = *(uint *)(local_a30 + 8);
                local_a34 = String::_opFormat((String *)&local_8f0,kAssign,"  {#%u}\n",
                                              (ulong)local_a38);
                if (local_a34 != 0) {
                  local_908 = 1;
                  local_6b4 = local_a34;
                  goto LAB_00158804;
                }
                local_a3c = _dumpBlockLiveness((BaseRAPass *)
                                               CONCAT44(in_stack_fffffffffffff444,
                                                        in_stack_fffffffffffff440),
                                               (String *)in_stack_fffffffffffff438,
                                               (RABlock *)in_stack_fffffffffffff430);
                if (local_a3c != 0) {
                  local_908 = 1;
                  local_6b4 = local_a3c;
                  goto LAB_00158804;
                }
                local_1b0 = &local_8f0;
                if ((byte)local_8f0 < 0x1f) {
                  pZVar8 = aZStack_8ef;
                  local_b98 = (ZoneAllocator *)(ulong)(byte)local_8f0;
                }
                else {
                  local_b98 = local_8e8;
                  pZVar8 = local_8d8;
                }
                local_190 = local_1b0;
                local_178 = local_1b0;
                local_168 = local_1b0;
                (*local_b58->_vptr_Logger[2])(local_b58,pZVar8,local_b98);
              }
            }
            for (local_8f4 = 0; local_8f4 < local_900; local_8f4 = local_8f4 + 1) {
              ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                  (in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0);
              local_a48 = *ppRVar6;
              ZoneVector<unsigned_int>::operator[]
                        ((ZoneVector<unsigned_int> *)in_stack_fffffffffffff3d8,
                         (size_t)in_stack_fffffffffffff3d0);
              local_a4c = ZoneVector<asmjit::v1_14::BaseNode_*>::reserve
                                    ((ZoneVector<asmjit::v1_14::BaseNode_*> *)
                                     in_stack_fffffffffffff3d8,
                                     (ZoneAllocator *)in_stack_fffffffffffff3d0,
                                     (uint32_t)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
              if (local_a4c != 0) {
                local_908 = 1;
                local_6b4 = local_a4c;
                goto LAB_00158804;
              }
              in_stack_fffffffffffff448 = local_a48 + 0x80;
              in_stack_fffffffffffff450 = (BaseRAPass *)(in_RDI + 0x18);
              ZoneVector<unsigned_int>::operator[]
                        ((ZoneVector<unsigned_int> *)in_stack_fffffffffffff3d8,
                         (size_t)in_stack_fffffffffffff3d0);
              local_a50 = ZoneVector<asmjit::v1_14::BaseNode_*>::reserve
                                    ((ZoneVector<asmjit::v1_14::BaseNode_*> *)
                                     in_stack_fffffffffffff3d8,
                                     (ZoneAllocator *)in_stack_fffffffffffff3d0,
                                     (uint32_t)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
              if (local_a50 != 0) {
                local_908 = 1;
                local_6b4 = local_a50;
                goto LAB_00158804;
              }
            }
            ZoneVector<unsigned_int>::release(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
            ZoneVector<unsigned_int>::release(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
            local_a54 = 2;
            for (local_8f4 = 0; local_8f4 < local_8f8; local_8f4 = local_8f4 + 1) {
              ppRVar5 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                                  ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_fffffffffffff3d8
                                   ,(size_t)in_stack_fffffffffffff3d0);
              local_a60 = *ppRVar5;
              local_19c = 2;
              local_198 = local_a60;
              bVar2 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                                (*(RABlockFlags *)(local_a60 + 0xc),kIsReachable);
              if (bVar2) {
                local_a64 = *(int *)(local_a60 + 8);
                local_a70 = *(long *)(local_a60 + 0x10);
                local_a78 = *(long *)(local_a60 + 0x18);
                iVar11 = local_a54;
                puVar7 = ZoneVector<unsigned_int>::operator[]
                                   ((ZoneVector<unsigned_int> *)in_stack_fffffffffffff3d8,
                                    (size_t)in_stack_fffffffffffff3d0);
                local_a7c = iVar11 + *puVar7 * 2;
                *(int *)(local_a60 + 0x20) = local_a54;
                *(int *)(local_a60 + 0x24) = local_a7c;
                memset(&local_a8c,0,0x10);
                memset(&local_a9c,0,0x10);
                ZoneBitVector::ForEachBitSet::ForEachBitSet
                          ((ForEachBitSet *)in_stack_fffffffffffff3c8,(ZoneBitVector *)0x157727);
                while (local_aa8 != 0) {
                  Support::BitVectorIterator<unsigned_long>::next
                            ((BitVectorIterator<unsigned_long> *)in_stack_fffffffffffff3f0);
                  ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                      (in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0);
                  local_ac8 = *ppRVar6;
                  local_140 = local_ac8 + 0x20;
                  local_128 = local_140;
                  puVar9 = RALiveCount::operator[]
                                     ((RALiveCount *)in_stack_fffffffffffff3d0,
                                      (RegGroup)((ulong)in_stack_fffffffffffff3c8 >> 0x38));
                  *puVar9 = *puVar9 + 1;
                  local_acc = RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::
                              openAt((RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>
                                      *)in_stack_fffffffffffff3e0,
                                     (ZoneAllocator *)in_stack_fffffffffffff3d8,
                                     (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20),
                                     (uint32_t)in_stack_fffffffffffff3d0);
                  if (local_acc != 0) {
                    local_908 = 1;
                    local_6b4 = local_acc;
                    goto LAB_00158804;
                  }
                }
                while( true ) {
                  local_148 = local_a70;
                  local_149 = 0x20;
                  bVar2 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                                    (*(NodeFlags *)(local_a70 + 0x11),kActsAsInst);
                  if (bVar2) {
                    local_ad8 = local_a70;
                    local_ae0 = *(long *)(local_a70 + 0x20);
                    if (local_ae0 == 0) {
                      DebugUtils::assertionFailed
                                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
                                 in_stack_fffffffffffff7c0);
                    }
                    local_ae8 = local_ae0 + 0x4c;
                    local_aec = *(uint *)(local_ae0 + 0x10);
                    *(int *)(local_a70 + 0x14) = local_a54;
                    *(undefined8 *)(local_ae0 + 0x1c) = local_a8c;
                    *(undefined8 *)(local_ae0 + 0x24) = local_a84;
                    for (local_af0 = 0; local_af0 < local_aec; local_af0 = local_af0 + 1) {
                      local_af8 = (undefined4 *)(local_ae8 + (ulong)local_af0 * 0x20);
                      local_afc = *local_af8;
                      ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                          (in_stack_fffffffffffff3d8,
                                           (size_t)in_stack_fffffffffffff3d0);
                      local_b08 = *ppRVar6;
                      ZoneVector<asmjit::v1_14::BaseNode_*>::appendUnsafe
                                ((ZoneVector<asmjit::v1_14::BaseNode_*> *)in_stack_fffffffffffff3d0,
                                 (BaseNode **)in_stack_fffffffffffff3c8);
                      local_a8 = local_af8;
                      local_ac = 2;
                      bVar2 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                        (local_af8[2],kWrite);
                      if (bVar2) {
                        ZoneVector<asmjit::v1_14::BaseNode_*>::appendUnsafe
                                  ((ZoneVector<asmjit::v1_14::BaseNode_*> *)
                                   in_stack_fffffffffffff3d0,(BaseNode **)in_stack_fffffffffffff3c8)
                        ;
                      }
                      if (*(int *)(local_b08 + 0x28) != local_a64) {
                        *(undefined4 *)(local_b08 + 0x28) = 0xffffffff;
                        local_60 = local_b08;
                        local_64 = 4;
                        local_30 = local_b08 + 0x24;
                        local_34 = 4;
                        *(uint *)local_30 = *(uint *)local_30 | 4;
                      }
                      local_d8 = local_af8;
                      local_dc = 0x20000;
                      bVar2 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                        (local_af8[2],kLast);
                      if ((bVar2) &&
                         (bVar2 = ZoneBitVector::bitAt
                                            ((ZoneBitVector *)in_stack_fffffffffffff3d8,
                                             (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20)),
                         !bVar2)) {
                        local_78 = local_af8 + 2;
                        local_7c = 0x40000;
                        *local_78 = *local_78 | 0x40000;
                      }
                      local_b10 = local_b08 + 0x50;
                      local_f8 = local_af8;
                      local_fc = 1;
                      Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                (local_af8[2],kRead);
                      local_b18 = RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>
                                  ::openAt((RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>
                                            *)in_stack_fffffffffffff400,
                                           (ZoneAllocator *)
                                           CONCAT44(in_stack_fffffffffffff3fc,
                                                    in_stack_fffffffffffff3f8),
                                           (uint32_t)((ulong)in_stack_fffffffffffff3f0 >> 0x20),
                                           (uint32_t)in_stack_fffffffffffff3f0,
                                           (bool *)in_stack_fffffffffffff3e8);
                      if (local_b18 != 0) {
                        local_908 = 1;
                        local_6b4 = local_b18;
                        goto LAB_00158804;
                      }
                      local_138 = local_b08 + 0x20;
                      local_b19 = (byte)((uint)*(undefined4 *)local_138 >> 8) & 0xf;
                      local_130 = local_138;
                      if ((local_b11 & 1) == 0) {
                        puVar9 = RALiveCount::operator[]
                                           ((RALiveCount *)in_stack_fffffffffffff3d0,
                                            (RegGroup)((ulong)in_stack_fffffffffffff3c8 >> 0x38));
                        *puVar9 = *puVar9 + 1;
                        puVar9 = RALiveCount::operator[]
                                           ((RALiveCount *)in_stack_fffffffffffff3d0,
                                            (RegGroup)((ulong)in_stack_fffffffffffff3c8 >> 0x38));
                        *puVar9 = *puVar9 + 1;
                      }
                      local_108 = local_af8;
                      local_10c = 0x40000;
                      bVar2 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                        (local_af8[2],kKill);
                      if (bVar2) {
                        local_e8 = local_af8;
                        local_ec = 1;
                        Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                  (local_af8[2],kRead);
                        RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::closeAt
                                  ((RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>
                                    *)in_stack_fffffffffffff3d8,
                                   (uint32_t)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
                        puVar9 = RALiveCount::operator[]
                                           ((RALiveCount *)in_stack_fffffffffffff3d0,
                                            (RegGroup)((ulong)in_stack_fffffffffffff3c8 >> 0x38));
                        *puVar9 = *puVar9 - 1;
                      }
                      if (*(char *)((long)local_af8 + 0xe) != -1) {
                        local_b20 = (uint)*(byte *)((long)local_af8 + 0xe);
                        local_28 = &local_b20;
                        *(uint *)(local_b08 + 0x2c) =
                             1 << (*(byte *)((long)local_af8 + 0xe) & 0x1f) |
                             *(uint *)(local_b08 + 0x2c);
                        if (local_b08[0x4b] == (RAWorkReg)0xff) {
                          puVar9 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                                             ((RARegMask *)in_stack_fffffffffffff3d0,
                                              (RegGroup *)in_stack_fffffffffffff3c8);
                          local_2c8 = *puVar9;
                          local_2cc = local_b20;
                          local_20 = &local_2cc;
                          if ((local_2c8 & 1 << ((byte)SUB41(local_b20,0) & 0x1f)) == 0) {
                            local_2c0 = local_b08;
                            local_2c4 = local_b20;
                            local_b08[0x4b] = SUB41(local_b20,0);
                          }
                        }
                      }
                      local_2a8 = local_af8;
                      if (local_af8[4] != 0) {
                        local_2b0 = local_af8;
                        local_28c = local_af8[4];
                        local_288 = local_b08;
                        *(uint *)(local_b08 + 0x30) = local_28c & *(uint *)(local_b08 + 0x30);
                        local_278 = local_b08;
                        local_1c8 = local_b08;
                        local_1cc = 0x10;
                        bVar2 = Support::
                                test<asmjit::v1_14::RAWorkRegFlags,asmjit::v1_14::RAWorkRegFlags>
                                          (*(RAWorkRegFlags *)(local_b08 + 0x24),kLeadConsecutive);
                        if (bVar2) {
                          local_2b8 = local_af8;
                          local_25c = local_af8[4];
                          local_258 = local_b08;
                          *(uint *)(local_b08 + 0x34) = local_25c & *(uint *)(local_b08 + 0x34);
                        }
                      }
                      local_240 = local_af8;
                      if (local_af8[5] != 0) {
                        local_248 = local_af8;
                        local_29c = local_af8[5];
                        local_298 = local_b08;
                        *(uint *)(local_b08 + 0x30) = local_29c & *(uint *)(local_b08 + 0x30);
                        local_280 = local_b08;
                        local_1b8 = local_b08;
                        local_1bc = 0x10;
                        bVar2 = Support::
                                test<asmjit::v1_14::RAWorkRegFlags,asmjit::v1_14::RAWorkRegFlags>
                                          (*(RAWorkRegFlags *)(local_b08 + 0x24),kLeadConsecutive);
                        if (bVar2) {
                          local_250 = local_af8;
                          local_26c = local_af8[5];
                          local_268 = local_b08;
                          *(uint *)(local_b08 + 0x34) = local_26c & *(uint *)(local_b08 + 0x34);
                        }
                      }
                      puVar9 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                                         ((RARegMask *)in_stack_fffffffffffff3d0,
                                          (RegGroup *)in_stack_fffffffffffff3c8);
                      if (*puVar9 != 0) {
                        local_238 = local_af8;
                        local_14 = 8;
                        local_18 = 0x40000;
                        local_11c = 0x40008;
                        local_118 = local_af8;
                        bVar2 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                          (local_af8[2],kKill|kOut);
                        if (!bVar2) {
                          in_stack_fffffffffffff400 = local_b08;
                          puVar9 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                                             ((RARegMask *)in_stack_fffffffffffff3d0,
                                              (RegGroup *)in_stack_fffffffffffff3c8);
                          local_22c = *puVar9;
                          *(uint *)(in_stack_fffffffffffff400 + 0x38) =
                               local_22c | *(uint *)(in_stack_fffffffffffff400 + 0x38);
                          local_228 = in_stack_fffffffffffff400;
                        }
                      }
                    }
                    local_220 = local_a70;
                    local_218 = local_a70;
                    if (*(char *)(local_a70 + 0x10) == '\x12') {
                      local_210 = *(long *)(in_RDI + 0x98);
                      local_208 = local_a70;
                      local_200 = local_a70;
                      local_1f8 = local_a70 + 0x80;
                      local_10 = local_1f8;
                      FuncFrame::updateCallStackAlignment
                                ((FuncFrame *)(local_210 + 0x2d0),(uint)*(byte *)(local_a70 + 0x85))
                      ;
                    }
                    local_a54 = local_a54 + 2;
                    RALiveCount::op<asmjit::v1_14::Support::Max>
                              ((RALiveCount *)in_stack_fffffffffffff3d0,
                               (RALiveCount *)in_stack_fffffffffffff3c8);
                  }
                  if (local_a70 == local_a78) break;
                  local_a70 = *(long *)(local_a70 + 8);
                  if (local_a70 == 0) {
                    DebugUtils::assertionFailed
                              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
                               in_stack_fffffffffffff7c0);
                  }
                }
                *(undefined8 *)(local_a60 + 0x34) = local_a9c;
                *(undefined8 *)(local_a60 + 0x3c) = local_a94;
                RALiveCount::op<asmjit::v1_14::Support::Max>
                          ((RALiveCount *)in_stack_fffffffffffff3d0,
                           (RALiveCount *)in_stack_fffffffffffff3c8);
                local_1f0 = local_a60;
                if (local_a54 != *(int *)(local_a60 + 0x24)) {
                  DebugUtils::assertionFailed
                            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
                             in_stack_fffffffffffff7c0);
                }
              }
            }
            for (local_8f4 = 0; local_8f4 < local_900; local_8f4 = local_8f4 + 1) {
              ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                  (in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0);
              pRVar1 = *ppRVar6;
              uVar4 = RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::width
                                ((RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>
                                  *)(pRVar1 + 0x50));
              if (uVar4 == 0) {
                fVar10 = 0.0;
              }
              else {
                fVar10 = (float)((double)*(uint *)(pRVar1 + 0x78) / (double)uVar4);
              }
              *(uint32_t *)(pRVar1 + 0x60) = uVar4;
              *(float *)(pRVar1 + 100) = fVar10;
              local_1d8 = *(long *)(pRVar1 + 8);
              *(float *)(pRVar1 + 0x68) = (float)*(byte *)(local_1d8 + 0xe) * 0.01 + fVar10;
              local_1e8 = pRVar1;
              local_1e0 = pRVar1;
            }
            if (local_b58 != (Logger *)0x0) {
              String::clear((String *)&local_8f0);
              _dumpLiveSpans(in_stack_fffffffffffff450,(String *)in_stack_fffffffffffff448);
              local_1a8 = &local_8f0;
              in_stack_fffffffffffff3c8 = local_8e8;
              in_stack_fffffffffffff3d0 = local_8d8;
              if ((byte)local_8f0 < 0x1f) {
                in_stack_fffffffffffff3d0 = aZStack_8ef;
                in_stack_fffffffffffff3c8 = (ZoneAllocator *)(ulong)(byte)local_8f0;
              }
              local_188 = local_1a8;
              local_180 = local_1a8;
              local_170 = local_1a8;
              (*local_b58->_vptr_Logger[2])
                        (local_b58,in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
            }
            ZoneVector<unsigned_int>::release(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
            local_6b4 = 0;
            local_908 = 1;
          }
        }
        else {
          local_908 = 1;
          local_6b4 = local_944;
        }
      }
      else {
        local_908 = 1;
        local_6b4 = local_940;
      }
    }
    else {
      local_908 = 1;
      local_6b4 = local_93c;
    }
  }
LAB_00158804:
  StringTmp<512UL>::~StringTmp((StringTmp<512UL> *)in_stack_fffffffffffff3c8);
  return local_6b4;
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::buildLiveness() noexcept {
#ifndef ASMJIT_NO_LOGGING
  Logger* logger = getLoggerIf(DiagnosticOptions::kRADebugLiveness);
  StringTmp<512> sb;
#endif

  ASMJIT_RA_LOG_FORMAT("[BuildLiveness]\n");

  uint32_t i;

  uint32_t numAllBlocks = blockCount();
  uint32_t numReachableBlocks = reachableBlockCount();

  uint32_t numWorkRegs = workRegCount();
  uint32_t numBitWords = ZoneBitVector::_wordsPerBits(numWorkRegs);

  if (!numWorkRegs) {
    ASMJIT_RA_LOG_FORMAT("  Done (no virtual registers)\n");
    return kErrorOk;
  }

  ZoneVector<uint32_t> nUsesPerWorkReg; // Number of USEs of each RAWorkReg.
  ZoneVector<uint32_t> nOutsPerWorkReg; // Number of OUTs of each RAWorkReg.
  ZoneVector<uint32_t> nInstsPerBlock;  // Number of instructions of each RABlock.

  ASMJIT_PROPAGATE(nUsesPerWorkReg.resize(allocator(), numWorkRegs));
  ASMJIT_PROPAGATE(nOutsPerWorkReg.resize(allocator(), numWorkRegs));
  ASMJIT_PROPAGATE(nInstsPerBlock.resize(allocator(), numAllBlocks));

  // Calculate GEN/KILL of Each Block
  // --------------------------------

  for (i = 0; i < numReachableBlocks; i++) {
    RABlock* block = _pov[i];
    ASMJIT_PROPAGATE(block->resizeLiveBits(numWorkRegs));

    BaseNode* node = block->last();
    BaseNode* stop = block->first();

    uint32_t nInsts = 0;
    for (;;) {
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();
        RAInst* raInst = inst->passData<RAInst>();
        ASMJIT_ASSERT(raInst != nullptr);

        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t count = raInst->tiedCount();

        for (uint32_t j = 0; j < count; j++) {
          RATiedReg* tiedReg = &tiedRegs[j];
          uint32_t workId = tiedReg->workId();

          // Update `nUses` and `nOuts`.
          nUsesPerWorkReg[workId] += 1u;
          nOutsPerWorkReg[workId] += uint32_t(tiedReg->isWrite());

          // Mark as:
          //   KILL - if this VirtReg is killed afterwards.
          //   LAST - if this VirtReg is last in this basic block.
          if (block->kill().bitAt(workId))
            tiedReg->addFlags(RATiedFlags::kKill);
          else if (!block->gen().bitAt(workId))
            tiedReg->addFlags(RATiedFlags::kLast);

          if (tiedReg->isWriteOnly()) {
            // KILL.
            block->kill().setBit(workId, true);
          }
          else {
            // GEN.
            block->kill().setBit(workId, false);
            block->gen().setBit(workId, true);
          }

          if (tiedReg->isLeadConsecutive()) {
            RAWorkReg* workReg = workRegById(workId);
            workReg->markLeadConsecutive();
          }

          if (tiedReg->hasConsecutiveParent()) {
            RAWorkReg* consecutiveParentReg = workRegById(tiedReg->consecutiveParent());
            ASMJIT_PROPAGATE(consecutiveParentReg->addImmediateConsecutive(allocator(), workId));
          }
        }

        nInsts++;
      }

      if (node == stop)
        break;

      node = node->prev();
      ASMJIT_ASSERT(node != nullptr);
    }

    nInstsPerBlock[block->blockId()] = nInsts;
  }

  // Calculate IN/OUT of Each Block
  // ------------------------------

#ifndef ASMJIT_NO_LOGGING
  uint32_t numVisits = numReachableBlocks;
#endif

  {
    ZoneStack<RABlock*> workList;
    ZoneBitVector workBits;

    ASMJIT_PROPAGATE(workList.init(allocator()));
    ASMJIT_PROPAGATE(workBits.resize(allocator(), blockCount(), true));

    for (i = 0; i < numReachableBlocks; i++) {
      RABlock* block = _pov[i];
      LiveOps::recalcInOut(block, numBitWords, true);
      ASMJIT_PROPAGATE(workList.append(block));
    }

    while (!workList.empty()) {
      RABlock* block = workList.popFirst();
      uint32_t blockId = block->blockId();

      workBits.setBit(blockId, false);
      if (LiveOps::recalcInOut(block, numBitWords)) {
        const RABlocks& predecessors = block->predecessors();
        uint32_t numPredecessors = predecessors.size();

        for (uint32_t j = 0; j < numPredecessors; j++) {
          RABlock* pred = predecessors[j];
          if (!workBits.bitAt(pred->blockId())) {
            workBits.setBit(pred->blockId(), true);
            ASMJIT_PROPAGATE(workList.append(pred));
          }
        }
      }
#ifndef ASMJIT_NO_LOGGING
      numVisits++;
#endif
    }

    workList.reset();
    workBits.release(allocator());
  }

  ASMJIT_RA_LOG_COMPLEX({
    logger->logf("  LiveIn/Out Done (%u visits)\n", numVisits);
    for (i = 0; i < numAllBlocks; i++) {
      RABlock* block = _blocks[i];

      ASMJIT_PROPAGATE(sb.assignFormat("  {#%u}\n", block->blockId()));
      ASMJIT_PROPAGATE(_dumpBlockLiveness(sb, block));

      logger->log(sb);
    }
  });

  // Reserve the space in each `RAWorkReg` for references
  // ----------------------------------------------------

  for (i = 0; i < numWorkRegs; i++) {
    RAWorkReg* workReg = workRegById(i);
    ASMJIT_PROPAGATE(workReg->_refs.reserve(allocator(), nUsesPerWorkReg[i]));
    ASMJIT_PROPAGATE(workReg->_writes.reserve(allocator(), nOutsPerWorkReg[i]));
  }

  // These are not needed anymore, so release the memory now so other allocations can reuse it.
  nUsesPerWorkReg.release(allocator());
  nOutsPerWorkReg.release(allocator());

  // Assign block and instruction positions, build LiveCount and LiveSpans
  // ---------------------------------------------------------------------

  // This is a starting position, reserving [0, 1] for function arguments.
  uint32_t position = 2;

  for (i = 0; i < numAllBlocks; i++) {
    RABlock* block = _blocks[i];
    if (!block->isReachable())
      continue;

    uint32_t blockId = block->blockId();

    BaseNode* node = block->first();
    BaseNode* stop = block->last();

    uint32_t endPosition = position + nInstsPerBlock[i] * 2;
    block->setFirstPosition(position);
    block->setEndPosition(endPosition);

    RALiveCount curLiveCount;
    RALiveCount maxLiveCount;

    // Process LIVE-IN.
    ZoneBitVector::ForEachBitSet it(block->liveIn());
    while (it.hasNext()) {
      RAWorkReg* workReg = _workRegs[uint32_t(it.next())];
      curLiveCount[workReg->group()]++;
      ASMJIT_PROPAGATE(workReg->liveSpans().openAt(allocator(), position, endPosition));
    }

    for (;;) {
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();
        RAInst* raInst = inst->passData<RAInst>();

        // Impossible - each processed instruction node must have an associated RAInst.
        ASMJIT_ASSERT(raInst != nullptr);

        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t count = raInst->tiedCount();

        inst->setPosition(position);
        raInst->_liveCount = curLiveCount;

        for (uint32_t j = 0; j < count; j++) {
          RATiedReg* tiedReg = &tiedRegs[j];
          uint32_t workId = tiedReg->workId();

          // Create refs and writes.
          RAWorkReg* workReg = workRegById(workId);
          workReg->_refs.appendUnsafe(node);
          if (tiedReg->isWrite()) {
            workReg->_writes.appendUnsafe(node);
          }

          if (workReg->singleBasicBlockId() != blockId) {
            workReg->markUseOfMultipleBasicBlocks();
          }

          // We couldn't calculate this in previous steps, but since we know all LIVE-OUT at this point it becomes
          // trivial. If this is the last instruction that uses this `workReg` and it's not LIVE-OUT then it is
          // KILLed here.
          if (tiedReg->isLast() && !block->liveOut().bitAt(workId)) {
            tiedReg->addFlags(RATiedFlags::kKill);
          }

          LiveRegSpans& liveSpans = workReg->liveSpans();
          bool wasOpen;
          ASMJIT_PROPAGATE(liveSpans.openAt(allocator(), position + !tiedReg->isRead(), endPosition, wasOpen));

          RegGroup group = workReg->group();
          if (!wasOpen) {
            curLiveCount[group]++;
            raInst->_liveCount[group]++;
          }

          if (tiedReg->isKill()) {
            liveSpans.closeAt(position + !tiedReg->isRead() + 1);
            curLiveCount[group]--;
          }

          // Update `RAWorkReg::useIdMask` and `RAWorkReg::hintRegId`.
          if (tiedReg->hasUseId()) {
            uint32_t useId = tiedReg->useId();
            workReg->addUseIdMask(Support::bitMask(useId));
            if (!workReg->hasHintRegId() && !Support::bitTest(raInst->_clobberedRegs[group], useId)) {
              workReg->setHintRegId(useId);
            }
          }

          if (tiedReg->useRegMask()) {
            workReg->restrictPreferredMask(tiedReg->useRegMask());
            if (workReg->isLeadConsecutive()) {
              workReg->restrictConsecutiveMask(tiedReg->useRegMask());
            }
          }

          if (tiedReg->outRegMask()) {
            workReg->restrictPreferredMask(tiedReg->outRegMask());
            if (workReg->isLeadConsecutive()) {
              workReg->restrictConsecutiveMask(tiedReg->outRegMask());
            }
          }

          // Update `RAWorkReg::clobberedSurvivalMask`.
          if (raInst->_clobberedRegs[group] && !tiedReg->isOutOrKill()) {
            workReg->addClobberSurvivalMask(raInst->_clobberedRegs[group]);
          }
        }

        if (node->isInvoke()) {
          func()->frame().updateCallStackAlignment(node->as<InvokeNode>()->detail().naturalStackAlignment());
        }

        position += 2;
        maxLiveCount.op<Support::Max>(raInst->_liveCount);
      }

      if (node == stop)
        break;

      node = node->next();
      ASMJIT_ASSERT(node != nullptr);
    }

    block->_maxLiveCount = maxLiveCount;
    _globalMaxLiveCount.op<Support::Max>(maxLiveCount);
    ASMJIT_ASSERT(position == block->endPosition());
  }

  // Calculate WorkReg statistics
  // ----------------------------

  for (i = 0; i < numWorkRegs; i++) {
    RAWorkReg* workReg = _workRegs[i];

    LiveRegSpans& spans = workReg->liveSpans();
    uint32_t width = spans.width();
    float freq = width ? float(double(workReg->_refs.size()) / double(width)) : float(0);

    RALiveStats& stats = workReg->liveStats();
    stats._width = width;
    stats._freq = freq;
    stats._priority = freq + float(int(workReg->virtReg()->weight())) * 0.01f;
  }

  ASMJIT_RA_LOG_COMPLEX({
    sb.clear();
    _dumpLiveSpans(sb);
    logger->log(sb);
  });

  nInstsPerBlock.release(allocator());

  return kErrorOk;
}